

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq_test.c
# Opt level: O0

void sender(char *mq_name)

{
  mqd_t tester_mq_00;
  _Bool local_11;
  mqd_t tester_mq;
  _Bool err;
  char *mq_name_local;
  
  local_11 = false;
  _tester_mq = mq_name;
  test_log("SENDER: creating mq...");
  tester_mq_00 = tester_mq_start(false,_tester_mq,&local_11);
  if ((local_11 & 1U) != 0) {
    err_sender();
  }
  test_log("SENDER: created mq");
  test_log("SENDER: sending COMPLETED...");
  tester_mq_send(tester_mq_00,"completed",true,0,false,false,&local_11);
  if ((local_11 & 1U) != 0) {
    err_sender();
  }
  test_log("SENDER: sent COMPLETED");
  sleep(3);
  test_log("SENDER: sending IGNORED...");
  tester_mq_send(tester_mq_00,"ignored",false,0,true,false,&local_11);
  if ((local_11 & 1U) != 0) {
    err_sender();
  }
  test_log("SENDER: sent IGNORED");
  sleep(3);
  test_log("SENDER: sending ACCEPTED...");
  tester_mq_send(tester_mq_00,"accepted",false,0,false,true,&local_11);
  if ((local_11 & 1U) != 0) {
    err_sender();
  }
  test_log("SENDER: sent ACCEPTED");
  sleep(3);
  test_log("SENDER: finishing...");
  tester_mq_finish(false,tester_mq_00,(char *)0x0,&local_11);
  if ((local_11 & 1U) != 0) {
    err_sender();
  }
  test_log("SENDER: finish");
  return;
}

Assistant:

void sender(const char * mq_name) {
    bool err = false;

    test_log("SENDER: creating mq...");
    mqd_t tester_mq = tester_mq_start(false, mq_name, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: created mq");

    test_log("SENDER: sending COMPLETED...");
    tester_mq_send(tester_mq, "completed", true, 0, false, false, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent COMPLETED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: sending IGNORED...");
    tester_mq_send(tester_mq, "ignored", false, 0, true, false, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent IGNORED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: sending ACCEPTED...");
    tester_mq_send(tester_mq, "accepted", false, 0, false, true, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent ACCEPTED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: finishing...");
    tester_mq_finish(false, tester_mq, NULL, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: finish");
}